

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# union_iterator.hpp
# Opt level: O0

bool __thiscall
burst::
union_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>_*,_std::vector<boost::iterator_range<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<boost::iterator_range<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>,_std::less<void>_>
::equal(union_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>_*,_std::vector<boost::iterator_range<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<boost::iterator_range<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>,_std::less<void>_>
        *this,union_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>_*,_std::vector<boost::iterator_range<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<boost::iterator_range<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>,_std::less<void>_>
              *that)

{
  bool bVar1;
  union_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>_*,_std::vector<boost::iterator_range<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<boost::iterator_range<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>,_std::less<void>_>
  *that_local;
  union_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>_*,_std::vector<boost::iterator_range<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<boost::iterator_range<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>,_std::less<void>_>
  *this_local;
  
  bVar1 = __gnu_cxx::operator==(&this->m_begin,&that->m_begin);
  if (!bVar1) {
    __assert_fail("this->m_begin == that.m_begin",
                  "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/include/burst/iterator/union_iterator.hpp"
                  ,0xa5,
                  "bool burst::union_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<__gnu_cxx::__normal_iterator<const int *, std::vector<int>>> *, std::vector<boost::iterator_range<__gnu_cxx::__normal_iterator<const int *, std::vector<int>>>>>>::equal(const union_iterator<RandomAccessIterator, Compare> &) const [RandomAccessIterator = __gnu_cxx::__normal_iterator<boost::iterator_range<__gnu_cxx::__normal_iterator<const int *, std::vector<int>>> *, std::vector<boost::iterator_range<__gnu_cxx::__normal_iterator<const int *, std::vector<int>>>>>, Compare = std::less<void>]"
                 );
  }
  bVar1 = std::
          equal<__gnu_cxx::__normal_iterator<boost::iterator_range<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>*,std::vector<boost::iterator_range<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>,std::allocator<boost::iterator_range<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>>>>,__gnu_cxx::__normal_iterator<boost::iterator_range<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>*,std::vector<boost::iterator_range<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>,std::allocator<boost::iterator_range<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>>>>>
                    ((this->m_begin)._M_current,(this->m_end)._M_current,(that->m_begin)._M_current,
                     (that->m_end)._M_current);
  return bVar1;
}

Assistant:

bool equal (const union_iterator & that) const
        {
            assert(this->m_begin == that.m_begin);
            return std::equal(this->m_begin, this->m_end, that.m_begin, that.m_end);
        }